

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableIntTest_Typedefs_Test<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_Typedefs_Test<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator it;
  local_iterator it_00;
  size_type sVar1;
  Hasher HVar2;
  const_local_iterator cli;
  local_iterator li;
  const_iterator ci;
  iterator i;
  const_pointer cp;
  pointer p;
  difference_type dt;
  size_type st;
  allocator_type at;
  key_equal ke;
  hasher h;
  value_type vt;
  key_type kt;
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb88;
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb90;
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffbe0;
  const_local_iterator *pcStack_3e0;
  size_type in_stack_fffffffffffffc28;
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffc30;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined1 local_398 [80];
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  const_iterator *pcStack_2f0;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_208;
  Hasher local_1f8;
  Hasher local_1e8;
  Hasher local_1d8;
  Hasher local_1c8;
  undefined1 local_1b8 [80];
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  size_type local_50;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_48;
  Hasher local_30;
  Hasher local_20;
  key_type local_10;
  undefined4 local_c;
  
  local_c = 0xfffffffe;
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffffb90,(key_type *)in_stack_fffffffffffffb88);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffffb90,
             (int)((ulong)in_stack_fffffffffffffb88 >> 0x20));
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffffb90,
             (int)((ulong)in_stack_fffffffffffffb88 >> 0x20));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_48,0,(int *)0x0);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::iterator::iterator((iterator *)in_stack_fffffffffffffb90);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_iterator::const_iterator((const_iterator *)in_stack_fffffffffffffb90);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::local_iterator::local_iterator((local_iterator *)in_stack_fffffffffffffb90);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_local_iterator::const_local_iterator((const_local_iterator *)in_stack_fffffffffffffb90);
  local_10 = google::
             BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::deleted_key((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)0xa22058);
  local_1d8 = (Hasher)google::
                      BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::hash_funct(in_stack_fffffffffffffba0);
  local_1c8 = local_1d8;
  local_20 = local_1d8;
  HVar2 = (Hasher)google::
                  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ::key_eq(in_stack_fffffffffffffba0);
  local_1f8 = HVar2;
  local_1e8 = HVar2;
  local_30 = HVar2;
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::get_allocator(in_stack_fffffffffffffb88);
  local_48.id_ = local_208.id_;
  local_48._4_4_ = local_208._4_4_;
  local_48.count_ = local_208.count_;
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_208);
  sVar1 = google::
          BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::size((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  *)0xa22192);
  local_50 = sVar1;
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffffc30);
  local_78 = local_218;
  uStack_70 = uStack_210;
  local_88 = local_228;
  uStack_80 = uStack_220;
  local_98 = local_238;
  uStack_90 = uStack_230;
  local_a8 = local_248;
  uStack_a0 = uStack_240;
  local_b8 = local_258;
  uStack_b0 = uStack_250;
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffffc30);
  it.super_iterator.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       local_2d8;
  it.super_iterator.ht =
       (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)uStack_2e0;
  it.super_iterator.pos.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       uStack_2d0;
  it.super_iterator.pos.row_current._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       local_2c8;
  it.super_iterator.pos.col_current = (const_nonempty_iterator)uStack_2c0;
  it.super_iterator.end.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       local_2b8;
  it.super_iterator.end.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       uStack_2b0;
  it.super_iterator.end.row_current._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       sVar1;
  it.super_iterator.end.col_current._0_4_ = in_stack_fffffffffffffbe0;
  it.super_iterator.end.col_current._4_4_ = HVar2.num_compares_;
  it.parent_ = HVar2._0_8_;
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_iterator::const_iterator(pcStack_2f0,it);
  local_d8 = local_268;
  uStack_d0 = uStack_260;
  local_e8 = local_278;
  uStack_e0 = uStack_270;
  local_f8 = local_288;
  uStack_f0 = uStack_280;
  local_108 = local_298;
  uStack_100 = uStack_290;
  local_118 = local_2a8;
  uStack_110 = uStack_2a0;
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  local_128 = local_308;
  uStack_120 = uStack_300;
  local_138 = local_318;
  uStack_130 = uStack_310;
  local_148 = local_328;
  uStack_140 = uStack_320;
  local_158 = local_338;
  uStack_150 = uStack_330;
  local_168 = local_348;
  uStack_160 = uStack_340;
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  it_00.super_local_iterator.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       local_3c8;
  it_00.super_local_iterator.ht =
       (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffc30;
  it_00.super_local_iterator.pos.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       uStack_3c0;
  it_00.super_local_iterator.pos.row_current._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       local_3b8;
  it_00.super_local_iterator.pos.col_current = (const_nonempty_iterator)uStack_3b0;
  it_00.super_local_iterator.end.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       local_3a8;
  it_00.super_local_iterator.end.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       uStack_3a0;
  it_00.super_local_iterator.end.row_current._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       sVar1;
  it_00.super_local_iterator.end.col_current._0_4_ = in_stack_fffffffffffffbe0;
  it_00.super_local_iterator.end.col_current._4_4_ = HVar2.num_compares_;
  it_00.parent_ = HVar2._0_8_;
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_local_iterator::const_local_iterator(pcStack_3e0,it_00);
  memcpy(local_1b8,local_398,0x50);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_48);
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, Typedefs) {
  // Make sure all the standard STL-y typedefs are defined.  The exact
  // key/value types don't matter here, so we only bother testing on
  // the int tables.  This is just a compile-time "test"; nothing here
  // can fail at runtime.
  this->ht_.set_deleted_key(-2);  // just so deleted_key succeeds
  typename TypeParam::key_type kt;               (void)kt;
  typename TypeParam::value_type vt;             (void)vt;  // value_type may not be copyable.  Easiest not to try.
  typename TypeParam::hasher h;
  typename TypeParam::key_equal ke;
  typename TypeParam::allocator_type at;

  typename TypeParam::size_type st;              (void)st;
  typename TypeParam::difference_type dt;        (void)dt;
  typename TypeParam::pointer p;                 (void)p;
  typename TypeParam::const_pointer cp;          (void)cp;

  typename TypeParam::iterator i;
  typename TypeParam::const_iterator ci;
  typename TypeParam::local_iterator li;
  typename TypeParam::const_local_iterator cli;

  // Now make sure the variables are used, so the compiler doesn't
  // complain.  Where possible, I "use" the variable by calling the
  // method that's supposed to return the unique instance of the
  // relevant type (eg. get_allocator()).  Otherwise, I try to call a
  // different, arbitrary function that returns the type.  Sometimes
  // the type isn't used at all, and there's no good way to use the
  // variable.
  kt = this->ht_.deleted_key();
  h = this->ht_.hash_funct();
  ke = this->ht_.key_eq();
  at = this->ht_.get_allocator();
  st = this->ht_.size();
  i = this->ht_.begin();
  ci = this->ht_.begin();
  li = this->ht_.begin(0);
  cli = this->ht_.begin(0);
}